

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

void anon_unknown.dwarf_56483::on_directory_change
               (uv_fs_event_t *handle,char *filename,int events,int status)

{
  long *plVar1;
  string pathSegment;
  allocator<char> local_41;
  string local_40 [32];
  
  plVar1 = (long *)handle->data;
  if (filename == (char *)0x0) {
    filename = "";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_40,filename,&local_41);
  (**(code **)(*plVar1 + 0x10))(plVar1,local_40,events,status);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void on_directory_change(uv_fs_event_t* handle, const char* filename,
                         int events, int status)
{
  const cmIBaseWatcher* const watcher =
    static_cast<const cmIBaseWatcher*>(handle->data);
  const std::string pathSegment(filename ? filename : "");
  watcher->Trigger(pathSegment, events, status);
}